

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O0

bool v_array_contains<unsigned_long>(v_array<unsigned_long> *A,unsigned_long x)

{
  unsigned_long *e;
  unsigned_long x_local;
  v_array<unsigned_long> *A_local;
  
  e = A->_begin;
  while( true ) {
    if (e == A->_end) {
      return false;
    }
    if (*e == x) break;
    e = e + 1;
  }
  return true;
}

Assistant:

bool v_array_contains(v_array<T>& A, T x)
{
  for (T* e = A._begin; e != A._end; ++e)
    if (*e == x)
      return true;
  return false;
}